

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void merge_cache_lcp_2way<false,unsigned_short>
               (uchar **from0,lcp_t *lcp_input0,unsigned_short *cache_input0,size_t n0,uchar **from1
               ,lcp_t *lcp_input1,unsigned_short *cache_input1,size_t n1,uchar **result,
               lcp_t *lcp_result,unsigned_short *cache_result)

{
  ushort cache0;
  uchar *puVar1;
  uchar *puVar2;
  uchar **ppuVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uchar **__dest;
  ushort cache1;
  lcp_t lcp0;
  uchar **ppuVar7;
  bool bVar8;
  bool bVar9;
  ushort local_8c;
  lcp_t *local_88;
  ushort *local_78;
  size_t local_70;
  ulong *local_68;
  ushort *local_60;
  size_t local_58;
  ulong local_40;
  int local_38;
  
  local_58 = n1;
  check_input<unsigned_short>(from0,lcp_input0,cache_input0,n0);
  check_input<unsigned_short>(from1,lcp_input1,cache_input1,n1);
  local_78 = cache_input0 + 1;
  cache0 = *cache_input0;
  local_60 = cache_input1 + 1;
  cache1 = *cache_input1;
  local_68 = lcp_input1;
  if (cache0 < cache1) {
    puVar1 = *from0;
    if (puVar1 == (uchar *)0x0) {
LAB_001d7b00:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    puVar2 = *from1;
    if (puVar2 == (uchar *)0x0) {
LAB_001d7b1f:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar4 = strcmp((char *)puVar1,(char *)puVar2);
    if (-1 < iVar4) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                   );
    }
    bVar8 = (cache0 & 0xff00) != 0;
    bVar9 = (cache0 & 0xff00) == (cache1 & 0xff00);
    if (bVar9 && bVar8) {
      if (puVar2[1] == '\0') {
        cache1 = 0;
      }
      else {
        cache1 = CONCAT11(puVar2[1],puVar2[2]);
      }
    }
    *result = puVar1;
    if (n0 == 1) {
LAB_001d74bb:
      __dest = result + 1;
      goto LAB_001d74c3;
    }
    lcp0 = *lcp_input0;
    uVar5 = (ulong)(bVar9 && bVar8);
    cache0 = cache_input0[1];
LAB_001d74ac:
    local_70 = n0 - 1;
    local_88 = lcp_input0 + 1;
    from0 = from0 + 1;
    local_78 = cache_input0 + 2;
    ppuVar7 = result + 1;
LAB_001d756a:
    do {
      check_lcp_and_cache<unsigned_short>(ppuVar7[-1],*from0,lcp0,cache0,*from1,uVar5,cache1);
      if (uVar5 < lcp0) {
        puVar1 = *from0;
        if (puVar1 == (uchar *)0x0) goto LAB_001d7b00;
        if (*from1 == (uchar *)0x0) goto LAB_001d7b1f;
        iVar4 = strcmp((char *)puVar1,(char *)*from1);
        if (-1 < iVar4) {
          __assert_fail("cmp(*from0, *from1) < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x4ae,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                       );
        }
        *ppuVar7 = puVar1;
        lcp0 = *local_88;
        cache0 = *local_78;
      }
      else {
        if (lcp0 < uVar5) {
          if (*from0 == (uchar *)0x0) goto LAB_001d7b00;
          puVar1 = *from1;
          if (puVar1 == (uchar *)0x0) goto LAB_001d7b1f;
          iVar4 = strcmp((char *)*from0,(char *)puVar1);
          if (iVar4 < 1) {
            __assert_fail("cmp(*from0, *from1) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4b7,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                         );
          }
          *ppuVar7 = puVar1;
          uVar5 = *local_68;
          cache1 = *local_60;
LAB_001d767a:
          local_60 = local_60 + 1;
          local_68 = local_68 + 1;
          __dest = ppuVar7 + 1;
          from1 = from1 + 1;
          local_58 = local_58 - 1;
          ppuVar3 = from0;
          ppuVar7 = __dest;
          if (local_58 == 0) goto LAB_001d79ff;
          goto LAB_001d756a;
        }
        if (cache0 < cache1) {
          puVar1 = *from0;
          if (puVar1 == (uchar *)0x0) goto LAB_001d7b00;
          puVar2 = *from1;
          if (puVar2 == (uchar *)0x0) goto LAB_001d7b1f;
          iVar4 = strcmp((char *)puVar1,(char *)puVar2);
          if (-1 < iVar4) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4c6,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                         );
          }
          local_8c = cache0 & 0xff00;
          uVar6 = uVar5;
          if (((cache0 & 0xff00) != 0) && (local_8c == (cache1 & 0xff00))) {
            uVar6 = uVar5 + 1;
            if (puVar2[uVar5 + 1] == '\0') {
              cache1 = 0;
            }
            else {
              cache1 = CONCAT11(puVar2[uVar5 + 1],puVar2[uVar5 + 2]);
            }
          }
          *ppuVar7 = puVar1;
          lcp0 = *local_88;
          cache0 = *local_78;
          uVar5 = uVar6;
        }
        else {
          if (cache1 < cache0) {
            puVar1 = *from0;
            if (puVar1 != (uchar *)0x0) {
              puVar2 = *from1;
              if (puVar2 != (uchar *)0x0) {
                iVar4 = strcmp((char *)puVar1,(char *)puVar2);
                if (iVar4 < 1) {
                  __assert_fail("cmp(*from0, *from1) > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                                ,0x4d6,
                                "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                               );
                }
                if (((cache0 & 0xff00) != 0) && ((cache0 & 0xff00) == (cache1 & 0xff00))) {
                  if (puVar1[lcp0 + 1] == '\0') {
                    cache0 = 0;
                    lcp0 = lcp0 + 1;
                  }
                  else {
                    cache0 = CONCAT11(puVar1[lcp0 + 1],puVar1[lcp0 + 2]);
                    lcp0 = lcp0 + 1;
                  }
                }
                *ppuVar7 = puVar2;
                uVar5 = *local_68;
                cache1 = *local_60;
                goto LAB_001d767a;
              }
              goto LAB_001d7b1f;
            }
            goto LAB_001d7b00;
          }
          local_8c._0_1_ = (char)cache0;
          if ((char)local_8c == '\0') {
            puVar1 = *from0;
            if (puVar1 == (uchar *)0x0) goto LAB_001d7b00;
            if (*from1 == (uchar *)0x0) goto LAB_001d7b1f;
            iVar4 = strcmp((char *)puVar1,(char *)*from1);
            if (iVar4 != 0) {
              __assert_fail("cmp(*from0, *from1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4e7,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                           );
            }
            *ppuVar7 = puVar1;
            if (cache0 != 0) goto LAB_001d7bf8;
            lcp0 = *local_88;
            cache0 = *local_78;
            cache1 = 0;
          }
          else {
            compare((uchar *)&local_40,*from0,(size_t)*from1);
            uVar5 = local_40;
            if (local_38 < 0) {
              *ppuVar7 = *from0;
              puVar1 = *from1;
              if (puVar1 == (uchar *)0x0) goto LAB_001d7bba;
              if (puVar1[local_40] == '\0') {
                cache1 = 0;
              }
              else {
                cache1 = CONCAT11(puVar1[local_40],puVar1[local_40 + 1]);
              }
              lcp0 = *local_88;
              cache0 = *local_78;
            }
            else {
              if (local_38 != 0) {
                *ppuVar7 = *from1;
                puVar1 = *from0;
                if (puVar1 != (uchar *)0x0) {
                  if (puVar1[local_40] == '\0') {
                    cache0 = 0;
                  }
                  else {
                    cache0 = CONCAT11(puVar1[local_40],puVar1[local_40 + 1]);
                  }
                  uVar5 = *local_68;
                  cache1 = *local_60;
                  lcp0 = local_40;
                  goto LAB_001d767a;
                }
                goto LAB_001d7bba;
              }
              *ppuVar7 = *from0;
              lcp0 = *local_88;
              cache0 = *local_78;
              cache1 = 0;
            }
          }
        }
      }
      local_78 = local_78 + 1;
      local_88 = local_88 + 1;
      __dest = ppuVar7 + 1;
      from0 = from0 + 1;
      local_70 = local_70 - 1;
      ppuVar7 = ppuVar7 + 1;
    } while (local_70 != 0);
  }
  else {
    local_70 = n0;
    local_88 = lcp_input0;
    if (cache1 < cache0) {
      puVar1 = *from0;
      if (puVar1 == (uchar *)0x0) goto LAB_001d7b00;
      puVar2 = *from1;
      if (puVar2 == (uchar *)0x0) goto LAB_001d7b1f;
      iVar4 = strcmp((char *)puVar1,(char *)puVar2);
      if (iVar4 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x45c,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                     );
      }
      bVar8 = (cache0 & 0xff00) != 0;
      bVar9 = (cache0 & 0xff00) == (cache1 & 0xff00);
      if (bVar9 && bVar8) {
        if (puVar1[1] == '\0') {
          cache0 = 0;
        }
        else {
          cache0 = CONCAT11(puVar1[1],puVar1[2]);
        }
      }
      *result = puVar2;
      __dest = result + 1;
      local_58 = n1 - 1;
      ppuVar3 = from0;
      if (local_58 == 0) {
LAB_001d79ff:
        from1 = ppuVar3;
        if (local_70 == 0) {
          __assert_fail("n0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x527,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                       );
        }
        goto LAB_001d7a14;
      }
      from1 = from1 + 1;
      local_68 = lcp_input1 + 1;
      cache1 = cache_input1[1];
      local_60 = cache_input1 + 2;
      uVar5 = *lcp_input1;
      lcp0 = (ulong)(bVar9 && bVar8);
      ppuVar7 = __dest;
      goto LAB_001d756a;
    }
    local_8c._0_1_ = (char)cache0;
    if ((char)local_8c == '\0') {
      puVar1 = *from0;
      if (puVar1 == (uchar *)0x0) goto LAB_001d7b00;
      if (*from1 == (uchar *)0x0) goto LAB_001d7b1f;
      iVar4 = strcmp((char *)puVar1,(char *)*from1);
      if (iVar4 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x470,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                     );
      }
      if (cache0 != 0) {
LAB_001d7bf8:
        __assert_fail("a != b or a==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x3f6,"unsigned int lcp(uint16_t, uint16_t)");
      }
      *result = puVar1;
      if (n0 == 1) goto LAB_001d74bb;
      lcp0 = *lcp_input0;
      cache0 = cache_input0[1];
      uVar5 = 0;
      cache1 = 0;
      goto LAB_001d74ac;
    }
    compare((uchar *)&local_40,*from0,(size_t)*from1);
    uVar5 = local_40;
    if (local_38 < 0) {
      *result = *from0;
      puVar1 = *from1;
      if (puVar1 == (uchar *)0x0) {
LAB_001d7bba:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[local_40] == '\0') {
        cache1 = 0;
      }
      else {
        cache1 = CONCAT11(puVar1[local_40],puVar1[local_40 + 1]);
      }
      __dest = result + 1;
      local_70 = n0 - 1;
      if (local_70 == 0) goto LAB_001d74c3;
      from0 = from0 + 1;
      lcp0 = *lcp_input0;
      local_88 = lcp_input0 + 1;
      cache0 = cache_input0[1];
      local_78 = cache_input0 + 2;
      ppuVar7 = __dest;
      goto LAB_001d756a;
    }
    __dest = result + 1;
    ppuVar7 = __dest;
    if (local_38 != 0) {
      *result = *from1;
      puVar1 = *from0;
      if (puVar1 == (uchar *)0x0) goto LAB_001d7bba;
      if (puVar1[local_40] == '\0') {
        cache0 = 0;
      }
      else {
        cache0 = CONCAT11(puVar1[local_40],puVar1[local_40 + 1]);
      }
      local_58 = n1 - 1;
      ppuVar3 = from0;
      if (local_58 == 0) goto LAB_001d79ff;
      from1 = from1 + 1;
      local_68 = lcp_input1 + 1;
      cache1 = cache_input1[1];
      local_60 = cache_input1 + 2;
      uVar5 = *lcp_input1;
      lcp0 = local_40;
      goto LAB_001d756a;
    }
    *result = *from0;
    local_70 = n0 - 1;
    if (local_70 != 0) {
      from0 = from0 + 1;
      lcp0 = *lcp_input0;
      local_88 = lcp_input0 + 1;
      cache0 = cache_input0[1];
      local_78 = cache_input0 + 2;
      cache1 = 0;
      goto LAB_001d756a;
    }
  }
LAB_001d74c3:
  local_70 = local_58;
  if (local_58 == 0) {
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x51e,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                 );
  }
LAB_001d7a14:
  memmove(__dest,from1,local_70 << 3);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}